

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<std::complex<double>_>::AddKel
          (TPZFrontNonSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  complex<double> *pcVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar2 = sourceindex->fNElements;
  if (0 < lVar2) {
    lVar12 = 0;
    do {
      iVar9 = Local(this,destinationindex->fStore[lVar12]);
      lVar13 = 0;
      do {
        iVar10 = Local(this,destinationindex->fStore[lVar13]);
        lVar3 = sourceindex->fStore[lVar12];
        lVar4 = sourceindex->fStore[lVar13];
        lVar5 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if (((lVar3 < 0 || lVar5 <= lVar3) || (lVar4 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar11 = (long)(this->super_TPZFront<std::complex<double>_>).fMaxFront * (long)iVar10;
        pcVar6 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        dVar7 = *(double *)(elmat->fElem[lVar5 * lVar4 + lVar3]._M_value + 8);
        pcVar1 = pcVar6 + lVar11 + iVar9;
        dVar8 = *(double *)(pcVar1->_M_value + 8);
        pcVar6 = pcVar6 + lVar11 + iVar9;
        *(double *)pcVar6->_M_value =
             *(double *)pcVar1->_M_value + *(double *)elmat->fElem[lVar5 * lVar4 + lVar3]._M_value;
        *(double *)(pcVar6->_M_value + 8) = dVar8 + dVar7;
        lVar13 = lVar13 + 1;
      } while (lVar2 != lVar13);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar2);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = 0; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}